

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::internal::XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes_abi_cxx11_
          (string *__return_storage_ptr__,XmlUnitTestResultPrinter *this,TestResult *result)

{
  ostream *poVar1;
  stringstream *psVar2;
  string *psVar3;
  TestProperty *pTVar4;
  size_t sVar5;
  char *__s;
  int i;
  allocator<char> local_89;
  stringstream *local_88;
  string local_80;
  string *local_60;
  string local_58;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  local_60 = __return_storage_ptr__;
  Message::Message((Message *)&local_38);
  local_88 = local_38.ptr_;
  if (0 < (int)((ulong)((long)this[2].output_file_._M_dataplus._M_p -
                       (long)this[2].super_EmptyTestEventListener.super_TestEventListener.
                             _vptr_TestEventListener) >> 6)) {
    poVar1 = (ostream *)(local_38.ptr_ + 0x10);
    i = 0;
    do {
      pTVar4 = TestResult::GetTestProperty((TestResult *)this,i);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      __s = (pTVar4->key_)._M_dataplus._M_p;
      if (__s == (char *)0x0) {
        sVar5 = 6;
        __s = "(null)";
      }
      else {
        sVar5 = strlen(__s);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"=",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,(pTVar4->value_)._M_dataplus._M_p,&local_89);
      EscapeXml(&local_80,&local_58,true);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,local_80._M_dataplus._M_p,local_80._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      i = i + 1;
    } while (i < (int)((ulong)((long)this[2].output_file_._M_dataplus._M_p -
                              (long)this[2].super_EmptyTestEventListener.super_TestEventListener.
                                    _vptr_TestEventListener) >> 6));
  }
  psVar3 = local_60;
  psVar2 = local_88;
  StringStreamToString(local_60,local_88);
  if (psVar2 != (stringstream *)0x0) {
    (**(code **)(*(long *)psVar2 + 8))(psVar2);
  }
  return psVar3;
}

Assistant:

std::string XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes(
    const TestResult& result) {
  Message attributes;
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    attributes << " " << property.key() << "="
        << "\"" << EscapeXmlAttribute(property.value()) << "\"";
  }
  return attributes.GetString();
}